

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_DynamicCastMessageInvalidReferenceType_Test::TestBody
          (LiteTest_DynamicCastMessageInvalidReferenceType_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_3e0;
  Message local_3d8 [2];
  bad_cast *anon_var_0;
  type e;
  byte local_395;
  bool gtest_caught_expected;
  undefined1 auStack_388 [8];
  TrueWithString gtest_msg;
  MessageLite *test_type_1_pointer_const_ref;
  CastType1 test_type_1;
  LiteTest_DynamicCastMessageInvalidReferenceType_Test *this_local;
  
  test_type_1.field_0._816_8_ = this;
  proto2_unittest::TestAllTypesLite::TestAllTypesLite
            ((TestAllTypesLite *)&test_type_1_pointer_const_ref);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_388 = (undefined1  [8])0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_388);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_388);
  if (bVar1) {
    local_395 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      DynamicCastMessage<proto2_unittest::TestPackedTypesLite>
                ((MessageLite *)&test_type_1_pointer_const_ref);
    }
    if ((local_395 & 1) != 0) goto LAB_00154739;
    std::__cxx11::string::operator=
              ((string *)auStack_388,
               "Expected: DynamicCastMessage<CastType2>(test_type_1_pointer_const_ref) throws an exception of type std::bad_cast.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_3d8);
  message = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_3e0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
             ,0x57b,message);
  testing::internal::AssertHelper::operator=(&local_3e0,local_3d8);
  testing::internal::AssertHelper::~AssertHelper(&local_3e0);
  testing::Message::~Message(local_3d8);
LAB_00154739:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_388);
  proto2_unittest::TestAllTypesLite::~TestAllTypesLite
            ((TestAllTypesLite *)&test_type_1_pointer_const_ref);
  return;
}

Assistant:

TEST(LiteTest, DynamicCastMessageInvalidReferenceType) {
  CastType1 test_type_1;
  const MessageLite& test_type_1_pointer_const_ref = test_type_1;
#if defined(ABSL_HAVE_EXCEPTIONS)
  EXPECT_THROW(DynamicCastMessage<CastType2>(test_type_1_pointer_const_ref),
               std::bad_cast);
#elif defined(GTEST_HAS_DEATH_TEST)
  ASSERT_DEATH(
      DynamicCastMessage<CastType2>(test_type_1_pointer_const_ref),
      absl::StrCat("Cannot downcast ", test_type_1.GetTypeName(), " to ",
                   CastType2::default_instance().GetTypeName()));
#else
  (void)test_type_1;
  (void)test_type_1_pointer_const_ref;
  GTEST_SKIP() << "Can't test the failure.";
#endif
}